

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

void __thiscall SVGChart::PlotDataContainer::ClearData(PlotDataContainer *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  pointer ppLVar3;
  pointer ppDVar4;
  pointer ppPVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  undefined8 *puVar9;
  void *pvVar10;
  long lVar11;
  pointer ppPVar12;
  long lVar13;
  
  ppPVar1 = (this->mXDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar12 = (this->mXDataList).
             super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if ((((ppPVar1 != ppPVar12) &&
       (ppPVar2 = (this->mYDataList).
                  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       ppPVar2 !=
       (this->mYDataList).
       super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
       _M_impl.super__Vector_impl_data._M_finish)) &&
      (ppLVar3 = (this->mLegendDataList).
                 super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      ppLVar3 !=
      (this->mLegendDataList).
      super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) &&
     ((ppDVar4 = (this->mDataDrawerList).
                 super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      ppDVar4 !=
      (this->mDataDrawerList).
      super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
      _M_impl.super__Vector_impl_data._M_finish &&
      (ppPVar5 = (this->mPlotDataSelectionList).
                 super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      ppPVar5 !=
      (this->mPlotDataSelectionList).
      super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish)))) {
    lVar13 = 0;
    do {
      plVar6 = *(long **)((long)ppPVar2 + lVar13);
      puVar7 = *(undefined8 **)((long)ppLVar3 + lVar13);
      plVar8 = *(long **)((long)ppDVar4 + lVar13);
      puVar9 = *(undefined8 **)((long)ppPVar5 + lVar13);
      if (*(long **)((long)ppPVar1 + lVar13) != (long *)0x0) {
        (**(code **)(**(long **)((long)ppPVar1 + lVar13) + 8))();
      }
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 8))(plVar6);
      }
      if (puVar7 != (undefined8 *)0x0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(puVar7 + 0xf));
        if ((long *)puVar7[0xb] != puVar7 + 0xd) {
          operator_delete((long *)puVar7[0xb],puVar7[0xd] + 1);
        }
        if ((long *)puVar7[6] != puVar7 + 8) {
          operator_delete((long *)puVar7[6],puVar7[8] + 1);
        }
        if ((long *)*puVar7 != puVar7 + 2) {
          operator_delete((long *)*puVar7,puVar7[2] + 1);
        }
        operator_delete(puVar7,0xa8);
      }
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar8 + 8))(plVar8);
      }
      if (puVar9 != (undefined8 *)0x0) {
        pvVar10 = (void *)*puVar9;
        if (pvVar10 != (void *)0x0) {
          operator_delete(pvVar10,puVar9[2] - (long)pvVar10);
        }
        operator_delete(puVar9,0x18);
      }
      ppPVar12 = (this->mXDataList).
                 super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if ((((pointer)((long)ppPVar1 + lVar13 + 8) == ppPVar12) ||
          ((pointer)((long)ppPVar2 + lVar13 + 8) ==
           (this->mYDataList).
           super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
           _M_impl.super__Vector_impl_data._M_finish)) ||
         (((pointer)((long)ppLVar3 + lVar13 + 8) ==
           (this->mLegendDataList).
           super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
           _M_impl.super__Vector_impl_data._M_finish ||
          ((pointer)((long)ppDVar4 + lVar13 + 8) ==
           (this->mDataDrawerList).
           super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
           ._M_impl.super__Vector_impl_data._M_finish)))) break;
      lVar11 = lVar13 + 8;
      lVar13 = lVar13 + 8;
    } while ((pointer)((long)ppPVar5 + lVar11) !=
             (this->mPlotDataSelectionList).
             super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppPVar1 = (this->mXDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar12 != ppPVar1) {
    (this->mXDataList).
    super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar1;
  }
  ppPVar1 = (this->mYDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mYDataList).
      super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
    (this->mYDataList).
    super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar1;
  }
  ppLVar3 = (this->mLegendDataList).
            super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->mLegendDataList).
      super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar3) {
    (this->mLegendDataList).
    super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar3;
  }
  ppDVar4 = (this->mDataDrawerList).
            super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mDataDrawerList).
      super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppDVar4) {
    (this->mDataDrawerList).
    super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppDVar4;
  }
  ppPVar5 = (this->mPlotDataSelectionList).
            super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mPlotDataSelectionList).
      super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar5) {
    (this->mPlotDataSelectionList).
    super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar5;
  }
  return;
}

Assistant:

void PlotDataContainer::ClearData () {
      PlotDataList::iterator theXI = mXDataList.begin ();
      PlotDataList::iterator theYI = mYDataList.begin ();
      LegendDataList::iterator theLI = mLegendDataList.begin ();
      DataDrawerList::iterator theDI = mDataDrawerList.begin ();
      PlotDataSelectionList::iterator thePI = mPlotDataSelectionList.begin ();

      for (;theXI!=mXDataList.end () && theYI!=mYDataList.end () && theLI!=mLegendDataList.end () && theDI != mDataDrawerList.end () && thePI != mPlotDataSelectionList.end ();) {
        PlotDataBase *theX = *theXI;
        PlotDataBase *theY = *theYI;
        LegendData *theL = *theLI;
        DataDrawerBase *theD = *theDI;
        PlotDataSelection *theP = *thePI;

        delete theX;
        delete theY;
        delete theL;
        delete theD;
        delete theP;

        theXI++;
        theYI++;
        theLI++;
        theDI++;
        thePI++;
      }
      mXDataList.clear ();
      mYDataList.clear ();
      mLegendDataList.clear ();
      mDataDrawerList.clear ();
      mPlotDataSelectionList.clear ();
    }